

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O2

void aom_highbd_lpf_horizontal_14_sse2
               (uint16_t *s,int pitch,uint8_t *blimit,uint8_t *limit,uint8_t *thresh,int bd)

{
  undefined8 uVar1;
  byte bVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  ushort uVar22;
  ushort uVar23;
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  uint16_t *puVar33;
  ulong uVar34;
  uint16_t *puVar35;
  long lVar36;
  long lVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  short sVar42;
  ushort uVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  short sVar67;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  short sVar68;
  short sVar69;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  short sVar81;
  undefined1 auVar82 [16];
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar89;
  short sVar90;
  short sVar91;
  short sVar92;
  short sVar93;
  short sVar94;
  short sVar95;
  short sVar96;
  short sVar97;
  short sVar98;
  undefined1 local_318 [16];
  ushort local_308;
  ushort uStack_306;
  ushort uStack_304;
  ushort uStack_302;
  longlong local_2f8;
  longlong lStack_2f0;
  __m128i pq [7];
  ushort local_248;
  ushort uStack_246;
  ushort uStack_244;
  ushort uStack_242;
  ushort uStack_240;
  ushort uStack_23e;
  __m128i q1q0;
  __m128i mask;
  __m128i thresh_1;
  __m128i limit_1;
  __m128i blimit_1;
  __m128i flat_pq [3];
  ushort local_1b8 [48];
  __m128i q [7];
  ushort local_e8;
  ushort uStack_e6;
  ushort uStack_e4;
  ushort uStack_e2;
  __m128i abs_p1p0;
  __m128i p1p0;
  __m128i hevhev;
  __m128i p [7];
  
  lVar36 = (long)pitch;
  puVar33 = s + -lVar36;
  puVar35 = s;
  for (lVar37 = 0; lVar37 != 0x70; lVar37 = lVar37 + 0x10) {
    *(undefined8 *)((long)p[0] + lVar37) = *(undefined8 *)puVar33;
    *(undefined8 *)((long)p[0] + lVar37 + 8) = 0;
    *(undefined8 *)((long)q[0] + lVar37) = *(undefined8 *)puVar35;
    *(undefined8 *)((long)q[0] + lVar37 + 8) = 0;
    puVar33 = puVar33 + -lVar36;
    puVar35 = puVar35 + lVar36;
  }
  auVar38 = *(undefined1 (*) [16])blimit;
  auVar5[0xd] = 0;
  auVar5._0_13_ = auVar38._0_13_;
  auVar5[0xe] = auVar38[7];
  auVar8[0xc] = auVar38[6];
  auVar8._0_12_ = auVar38._0_12_;
  auVar8._13_2_ = auVar5._13_2_;
  auVar11[0xb] = 0;
  auVar11._0_11_ = auVar38._0_11_;
  auVar11._12_3_ = auVar8._12_3_;
  auVar14[10] = auVar38[5];
  auVar14._0_10_ = auVar38._0_10_;
  auVar14._11_4_ = auVar11._11_4_;
  auVar17[9] = 0;
  auVar17._0_9_ = auVar38._0_9_;
  auVar17._10_5_ = auVar14._10_5_;
  auVar20[8] = auVar38[4];
  auVar20._0_8_ = auVar38._0_8_;
  auVar20._9_6_ = auVar17._9_6_;
  auVar24._7_8_ = 0;
  auVar24._0_7_ = auVar20._8_7_;
  auVar27._1_8_ = SUB158(auVar24 << 0x40,7);
  auVar27[0] = auVar38[3];
  auVar27._9_6_ = 0;
  auVar28._1_10_ = SUB1510(auVar27 << 0x30,5);
  auVar28[0] = auVar38[2];
  auVar28._11_4_ = 0;
  auVar39._3_12_ = SUB1512(auVar28 << 0x20,3);
  auVar39[2] = auVar38[1];
  auVar39[0] = auVar38[0];
  auVar39[1] = 0;
  auVar39[0xf] = 0;
  auVar40 = ZEXT416(bd - 8);
  blimit_1 = (__m128i)psllw(auVar39,auVar40);
  auVar38 = *(undefined1 (*) [16])limit;
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar38._0_13_;
  auVar3[0xe] = auVar38[7];
  auVar6[0xc] = auVar38[6];
  auVar6._0_12_ = auVar38._0_12_;
  auVar6._13_2_ = auVar3._13_2_;
  auVar9[0xb] = 0;
  auVar9._0_11_ = auVar38._0_11_;
  auVar9._12_3_ = auVar6._12_3_;
  auVar12[10] = auVar38[5];
  auVar12._0_10_ = auVar38._0_10_;
  auVar12._11_4_ = auVar9._11_4_;
  auVar15[9] = 0;
  auVar15._0_9_ = auVar38._0_9_;
  auVar15._10_5_ = auVar12._10_5_;
  auVar18[8] = auVar38[4];
  auVar18._0_8_ = auVar38._0_8_;
  auVar18._9_6_ = auVar15._9_6_;
  auVar25._7_8_ = 0;
  auVar25._0_7_ = auVar18._8_7_;
  auVar29._1_8_ = SUB158(auVar25 << 0x40,7);
  auVar29[0] = auVar38[3];
  auVar29._9_6_ = 0;
  auVar30._1_10_ = SUB1510(auVar29 << 0x30,5);
  auVar30[0] = auVar38[2];
  auVar30._11_4_ = 0;
  auVar21[2] = auVar38[1];
  auVar21._0_2_ = auVar38._0_2_;
  auVar21._3_12_ = SUB1512(auVar30 << 0x20,3);
  auVar38._0_2_ = auVar38._0_2_ & 0xff;
  auVar38._2_13_ = auVar21._2_13_;
  auVar38[0xf] = 0;
  limit_1 = (__m128i)psllw(auVar38,auVar40);
  auVar38 = *(undefined1 (*) [16])thresh;
  auVar4[0xd] = 0;
  auVar4._0_13_ = auVar38._0_13_;
  auVar4[0xe] = auVar38[7];
  auVar7[0xc] = auVar38[6];
  auVar7._0_12_ = auVar38._0_12_;
  auVar7._13_2_ = auVar4._13_2_;
  auVar10[0xb] = 0;
  auVar10._0_11_ = auVar38._0_11_;
  auVar10._12_3_ = auVar7._12_3_;
  auVar13[10] = auVar38[5];
  auVar13._0_10_ = auVar38._0_10_;
  auVar13._11_4_ = auVar10._11_4_;
  auVar16[9] = 0;
  auVar16._0_9_ = auVar38._0_9_;
  auVar16._10_5_ = auVar13._10_5_;
  auVar19[8] = auVar38[4];
  auVar19._0_8_ = auVar38._0_8_;
  auVar19._9_6_ = auVar16._9_6_;
  auVar26._7_8_ = 0;
  auVar26._0_7_ = auVar19._8_7_;
  auVar31._1_8_ = SUB158(auVar26 << 0x40,7);
  auVar31[0] = auVar38[3];
  auVar31._9_6_ = 0;
  auVar32._1_10_ = SUB1510(auVar31 << 0x30,5);
  auVar32[0] = auVar38[2];
  auVar32._11_4_ = 0;
  auVar41._3_12_ = SUB1512(auVar32 << 0x20,3);
  auVar41[2] = auVar38[1];
  auVar41[0] = auVar38[0];
  auVar41[1] = 0;
  auVar41[0xf] = 0;
  thresh_1 = (__m128i)psllw(auVar41,auVar40);
  bVar2 = (char)bd - 1U & 0x1f;
  auVar38 = ZEXT416((uint)(1 << bVar2));
  for (uVar34 = (ulong)(uint)(0 << bVar2); uVar34 != 0x70; uVar34 = uVar34 + 0x10) {
    uVar1 = *(undefined8 *)((long)q[0] + uVar34);
    *(undefined8 *)((long)pq[0] + uVar34) = *(undefined8 *)((long)p[0] + uVar34);
    *(undefined8 *)((long)pq[0] + uVar34 + 8) = uVar1;
  }
  auVar38 = pshuflw(auVar38,auVar38,0);
  local_318._4_4_ = auVar38._0_4_;
  local_318._0_4_ = local_318._4_4_;
  local_318._8_4_ = local_318._4_4_;
  local_318._12_4_ = local_318._4_4_;
  highbd_hev_filter_mask_x_sse2
            (pq,4,&p1p0,&q1q0,&abs_p1p0,&limit_1,&blimit_1,&thresh_1,&hevhev,&mask);
  auVar38 = psllw(_DAT_0046d7b0,ZEXT416((uint)bd));
  auVar44._8_4_ = 0xffffffff;
  auVar44._0_8_ = 0xffffffffffffffff;
  auVar44._12_4_ = 0xffffffff;
  auVar38 = paddsw(auVar38,auVar44);
  auVar38 = psubsw(auVar38,local_318);
  auVar39 = psubsw((undefined1  [16])0x0,local_318);
  auVar41 = psubsw((undefined1  [16])p1p0,local_318);
  auVar40._2_2_ = q1q0[0]._2_2_;
  auVar40._0_2_ = (ushort)q1q0[0];
  auVar40._4_12_ = q1q0._4_12_;
  auVar79 = psubsw(auVar40,local_318);
  auVar40 = psubsw(auVar41,auVar79);
  sVar87 = auVar38._0_2_;
  sVar68 = auVar40._0_2_;
  uVar55 = (ushort)(sVar87 < sVar68) * sVar87 | (ushort)(sVar87 >= sVar68) * sVar68;
  sVar88 = auVar38._2_2_;
  sVar68 = auVar40._2_2_;
  uVar60 = (ushort)(sVar88 < sVar68) * sVar88 | (ushort)(sVar88 >= sVar68) * sVar68;
  sVar89 = auVar38._4_2_;
  sVar68 = auVar40._4_2_;
  uVar61 = (ushort)(sVar89 < sVar68) * sVar89 | (ushort)(sVar89 >= sVar68) * sVar68;
  sVar90 = auVar38._6_2_;
  sVar68 = auVar40._6_2_;
  uVar62 = (ushort)(sVar90 < sVar68) * sVar90 | (ushort)(sVar90 >= sVar68) * sVar68;
  sVar69 = auVar38._8_2_;
  sVar68 = auVar40._8_2_;
  uVar63 = (ushort)(sVar69 < sVar68) * sVar69 | (ushort)(sVar69 >= sVar68) * sVar68;
  sVar73 = auVar38._10_2_;
  sVar68 = auVar40._10_2_;
  uVar64 = (ushort)(sVar73 < sVar68) * sVar73 | (ushort)(sVar73 >= sVar68) * sVar68;
  sVar75 = auVar38._12_2_;
  sVar68 = auVar40._12_2_;
  sVar72 = auVar40._14_2_;
  uVar65 = (ushort)(sVar75 < sVar68) * sVar75 | (ushort)(sVar75 >= sVar68) * sVar68;
  sVar77 = auVar38._14_2_;
  uVar66 = (ushort)(sVar77 < sVar72) * sVar77 | (ushort)(sVar77 >= sVar72) * sVar72;
  sVar68 = auVar39._0_2_;
  auVar56._0_2_ = (ushort)((short)uVar55 < sVar68) * sVar68 | ((short)uVar55 >= sVar68) * uVar55;
  sVar72 = auVar39._2_2_;
  auVar56._2_2_ = (ushort)((short)uVar60 < sVar72) * sVar72 | ((short)uVar60 >= sVar72) * uVar60;
  sVar74 = auVar39._4_2_;
  auVar56._4_2_ = (ushort)((short)uVar61 < sVar74) * sVar74 | ((short)uVar61 >= sVar74) * uVar61;
  sVar76 = auVar39._6_2_;
  auVar56._6_2_ = (ushort)((short)uVar62 < sVar76) * sVar76 | ((short)uVar62 >= sVar76) * uVar62;
  sVar83 = auVar39._8_2_;
  auVar56._8_2_ = (ushort)((short)uVar63 < sVar83) * sVar83 | ((short)uVar63 >= sVar83) * uVar63;
  sVar84 = auVar39._10_2_;
  auVar56._10_2_ = (ushort)((short)uVar64 < sVar84) * sVar84 | ((short)uVar64 >= sVar84) * uVar64;
  sVar85 = auVar39._12_2_;
  auVar56._12_2_ = (ushort)((short)uVar65 < sVar85) * sVar85 | ((short)uVar65 >= sVar85) * uVar65;
  sVar86 = auVar39._14_2_;
  auVar56._14_2_ = (ushort)((short)uVar66 < sVar86) * sVar86 | ((short)uVar66 >= sVar86) * uVar66;
  auVar38 = psubsw(auVar56 >> 0x40 & (undefined1  [16])hevhev,auVar56);
  auVar38 = psubsw(auVar38,auVar56);
  auVar38 = psubsw(auVar38,auVar56);
  sVar42 = auVar38._0_2_;
  uVar55 = (ushort)(sVar87 < sVar42) * sVar87 | (ushort)(sVar87 >= sVar42) * sVar42;
  sVar42 = auVar38._2_2_;
  uVar60 = (ushort)(sVar88 < sVar42) * sVar88 | (ushort)(sVar88 >= sVar42) * sVar42;
  sVar42 = auVar38._4_2_;
  uVar61 = (ushort)(sVar89 < sVar42) * sVar89 | (ushort)(sVar89 >= sVar42) * sVar42;
  sVar42 = auVar38._6_2_;
  uVar62 = (ushort)(sVar90 < sVar42) * sVar90 | (ushort)(sVar90 >= sVar42) * sVar42;
  sVar42 = auVar38._8_2_;
  uVar63 = (ushort)(sVar69 < sVar42) * sVar69 | (ushort)(sVar69 >= sVar42) * sVar42;
  sVar42 = auVar38._10_2_;
  uVar64 = (ushort)(sVar73 < sVar42) * sVar73 | (ushort)(sVar73 >= sVar42) * sVar42;
  sVar42 = auVar38._12_2_;
  sVar67 = auVar38._14_2_;
  uVar65 = (ushort)(sVar75 < sVar42) * sVar75 | (ushort)(sVar75 >= sVar42) * sVar42;
  uVar66 = (ushort)(sVar77 < sVar67) * sVar77 | (ushort)(sVar77 >= sVar67) * sVar67;
  auVar70._0_2_ = (ushort)((short)uVar55 < sVar68) * sVar68 | ((short)uVar55 >= sVar68) * uVar55;
  auVar70._2_2_ = (ushort)((short)uVar60 < sVar72) * sVar72 | ((short)uVar60 >= sVar72) * uVar60;
  auVar70._4_2_ = (ushort)((short)uVar61 < sVar74) * sVar74 | ((short)uVar61 >= sVar74) * uVar61;
  auVar70._6_2_ = (ushort)((short)uVar62 < sVar76) * sVar76 | ((short)uVar62 >= sVar76) * uVar62;
  auVar70._8_2_ = (ushort)((short)uVar63 < sVar83) * sVar83 | ((short)uVar63 >= sVar83) * uVar63;
  auVar70._10_2_ = (ushort)((short)uVar64 < sVar84) * sVar84 | ((short)uVar64 >= sVar84) * uVar64;
  auVar70._12_2_ = (ushort)((short)uVar65 < sVar85) * sVar85 | ((short)uVar65 >= sVar85) * uVar65;
  auVar70._14_2_ = (ushort)((short)uVar66 < sVar86) * sVar86 | ((short)uVar66 >= sVar86) * uVar66;
  auVar70 = auVar70 & (undefined1  [16])mask;
  auVar57._0_8_ = auVar70._0_8_;
  auVar57._8_4_ = auVar70._0_4_;
  auVar57._12_4_ = auVar70._4_4_;
  auVar38 = paddsw(auVar57,_DAT_0046d7c0);
  sVar42 = auVar38._0_2_;
  uVar55 = (ushort)(sVar87 < sVar42) * sVar87 | (ushort)(sVar87 >= sVar42) * sVar42;
  sVar42 = auVar38._2_2_;
  uVar60 = (ushort)(sVar88 < sVar42) * sVar88 | (ushort)(sVar88 >= sVar42) * sVar42;
  sVar42 = auVar38._4_2_;
  uVar61 = (ushort)(sVar89 < sVar42) * sVar89 | (ushort)(sVar89 >= sVar42) * sVar42;
  sVar42 = auVar38._6_2_;
  uVar62 = (ushort)(sVar90 < sVar42) * sVar90 | (ushort)(sVar90 >= sVar42) * sVar42;
  sVar42 = auVar38._8_2_;
  uVar63 = (ushort)(sVar69 < sVar42) * sVar69 | (ushort)(sVar69 >= sVar42) * sVar42;
  sVar42 = auVar38._10_2_;
  uVar64 = (ushort)(sVar73 < sVar42) * sVar73 | (ushort)(sVar73 >= sVar42) * sVar42;
  sVar42 = auVar38._12_2_;
  sVar67 = auVar38._14_2_;
  uVar65 = (ushort)(sVar75 < sVar42) * sVar75 | (ushort)(sVar75 >= sVar42) * sVar42;
  uVar66 = (ushort)(sVar77 < sVar67) * sVar77 | (ushort)(sVar77 >= sVar67) * sVar67;
  auVar58._0_2_ = (ushort)((short)uVar55 < sVar68) * sVar68 | ((short)uVar55 >= sVar68) * uVar55;
  auVar58._2_2_ = (ushort)((short)uVar60 < sVar72) * sVar72 | ((short)uVar60 >= sVar72) * uVar60;
  auVar58._4_2_ = (ushort)((short)uVar61 < sVar74) * sVar74 | ((short)uVar61 >= sVar74) * uVar61;
  auVar58._6_2_ = (ushort)((short)uVar62 < sVar76) * sVar76 | ((short)uVar62 >= sVar76) * uVar62;
  auVar58._8_2_ = (ushort)((short)uVar63 < sVar83) * sVar83 | ((short)uVar63 >= sVar83) * uVar63;
  auVar58._10_2_ = (ushort)((short)uVar64 < sVar84) * sVar84 | ((short)uVar64 >= sVar84) * uVar64;
  auVar58._12_2_ = (ushort)((short)uVar65 < sVar85) * sVar85 | ((short)uVar65 >= sVar85) * uVar65;
  auVar58._14_2_ = (ushort)((short)uVar66 < sVar86) * sVar86 | ((short)uVar66 >= sVar86) * uVar66;
  auVar38 = psraw(auVar58,3);
  auVar71._0_2_ = auVar38._0_2_ + 1;
  auVar71._2_2_ = auVar38._2_2_ + 1;
  auVar71._4_2_ = auVar38._4_2_ + 1;
  auVar71._6_2_ = auVar38._6_2_ + 1;
  auVar71._8_2_ = auVar38._0_2_ + 1;
  auVar71._10_2_ = auVar38._2_2_ + 1;
  auVar71._12_2_ = auVar38._4_2_ + 1;
  auVar71._14_2_ = auVar38._6_2_ + 1;
  auVar39 = psraw(auVar71,1);
  auVar45._8_8_ = SUB168(~(undefined1  [16])hevhev & auVar39,8);
  auVar45._0_8_ = auVar38._8_8_;
  auVar59._8_8_ = SUB168(~(undefined1  [16])hevhev & auVar39,0);
  auVar59._0_8_ = auVar38._0_8_;
  auVar39 = psubsw(auVar79,auVar59);
  auVar38 = paddsw(auVar45,auVar41);
  sVar42 = auVar39._0_2_;
  uVar55 = (ushort)(sVar87 < sVar42) * sVar87 | (ushort)(sVar87 >= sVar42) * sVar42;
  sVar42 = auVar39._2_2_;
  uVar60 = (ushort)(sVar88 < sVar42) * sVar88 | (ushort)(sVar88 >= sVar42) * sVar42;
  sVar42 = auVar39._4_2_;
  uVar61 = (ushort)(sVar89 < sVar42) * sVar89 | (ushort)(sVar89 >= sVar42) * sVar42;
  sVar42 = auVar39._6_2_;
  uVar62 = (ushort)(sVar90 < sVar42) * sVar90 | (ushort)(sVar90 >= sVar42) * sVar42;
  sVar42 = auVar39._8_2_;
  uVar63 = (ushort)(sVar69 < sVar42) * sVar69 | (ushort)(sVar69 >= sVar42) * sVar42;
  sVar42 = auVar39._10_2_;
  uVar64 = (ushort)(sVar73 < sVar42) * sVar73 | (ushort)(sVar73 >= sVar42) * sVar42;
  sVar42 = auVar39._12_2_;
  sVar67 = auVar39._14_2_;
  uVar65 = (ushort)(sVar75 < sVar42) * sVar75 | (ushort)(sVar75 >= sVar42) * sVar42;
  uVar66 = (ushort)(sVar77 < sVar67) * sVar77 | (ushort)(sVar77 >= sVar67) * sVar67;
  auVar80._0_2_ = (ushort)((short)uVar55 < sVar68) * sVar68 | ((short)uVar55 >= sVar68) * uVar55;
  auVar80._2_2_ = (ushort)((short)uVar60 < sVar72) * sVar72 | ((short)uVar60 >= sVar72) * uVar60;
  auVar80._4_2_ = (ushort)((short)uVar61 < sVar74) * sVar74 | ((short)uVar61 >= sVar74) * uVar61;
  auVar80._6_2_ = (ushort)((short)uVar62 < sVar76) * sVar76 | ((short)uVar62 >= sVar76) * uVar62;
  auVar80._8_2_ = (ushort)((short)uVar63 < sVar83) * sVar83 | ((short)uVar63 >= sVar83) * uVar63;
  auVar80._10_2_ = (ushort)((short)uVar64 < sVar84) * sVar84 | ((short)uVar64 >= sVar84) * uVar64;
  auVar80._12_2_ = (ushort)((short)uVar65 < sVar85) * sVar85 | ((short)uVar65 >= sVar85) * uVar65;
  auVar80._14_2_ = (ushort)((short)uVar66 < sVar86) * sVar86 | ((short)uVar66 >= sVar86) * uVar66;
  sVar42 = auVar38._0_2_;
  uVar55 = (ushort)(sVar87 < sVar42) * sVar87 | (ushort)(sVar87 >= sVar42) * sVar42;
  sVar87 = auVar38._2_2_;
  uVar60 = (ushort)(sVar88 < sVar87) * sVar88 | (ushort)(sVar88 >= sVar87) * sVar87;
  sVar87 = auVar38._4_2_;
  uVar61 = (ushort)(sVar89 < sVar87) * sVar89 | (ushort)(sVar89 >= sVar87) * sVar87;
  sVar87 = auVar38._6_2_;
  uVar62 = (ushort)(sVar90 < sVar87) * sVar90 | (ushort)(sVar90 >= sVar87) * sVar87;
  sVar87 = auVar38._8_2_;
  uVar63 = (ushort)(sVar69 < sVar87) * sVar69 | (ushort)(sVar69 >= sVar87) * sVar87;
  sVar87 = auVar38._10_2_;
  uVar64 = (ushort)(sVar73 < sVar87) * sVar73 | (ushort)(sVar73 >= sVar87) * sVar87;
  sVar87 = auVar38._12_2_;
  sVar88 = auVar38._14_2_;
  uVar65 = (ushort)(sVar75 < sVar87) * sVar75 | (ushort)(sVar75 >= sVar87) * sVar87;
  uVar66 = (ushort)(sVar77 < sVar88) * sVar77 | (ushort)(sVar77 >= sVar88) * sVar88;
  auVar46._0_2_ = (ushort)((short)uVar55 < sVar68) * sVar68 | ((short)uVar55 >= sVar68) * uVar55;
  auVar46._2_2_ = (ushort)((short)uVar60 < sVar72) * sVar72 | ((short)uVar60 >= sVar72) * uVar60;
  auVar46._4_2_ = (ushort)((short)uVar61 < sVar74) * sVar74 | ((short)uVar61 >= sVar74) * uVar61;
  auVar46._6_2_ = (ushort)((short)uVar62 < sVar76) * sVar76 | ((short)uVar62 >= sVar76) * uVar62;
  auVar46._8_2_ = (ushort)((short)uVar63 < sVar83) * sVar83 | ((short)uVar63 >= sVar83) * uVar63;
  auVar46._10_2_ = (ushort)((short)uVar64 < sVar84) * sVar84 | ((short)uVar64 >= sVar84) * uVar64;
  auVar46._12_2_ = (ushort)((short)uVar65 < sVar85) * sVar85 | ((short)uVar65 >= sVar85) * uVar65;
  auVar46._14_2_ = (ushort)((short)uVar66 < sVar86) * sVar86 | ((short)uVar66 >= sVar86) * uVar66;
  auVar39 = paddsw(auVar80,local_318);
  auVar38 = paddsw(auVar46,local_318);
  highbd_flat_mask4_sse2(pq,(__m128i *)&local_e8,(__m128i *)&local_248,bd);
  local_308 = (ushort)mask[0];
  uStack_306 = mask[0]._2_2_;
  uStack_304 = mask[0]._4_2_;
  uStack_302 = mask[0]._6_2_;
  local_308 = local_308 & local_e8;
  uStack_306 = uStack_306 & uStack_e6;
  uStack_304 = uStack_304 & uStack_e4;
  uStack_302 = uStack_302 & uStack_e2;
  auVar79._0_2_ = -(ushort)(local_308 == 0);
  auVar79._2_2_ = -(ushort)(uStack_306 == 0);
  auVar79._4_2_ = -(ushort)(uStack_304 == 0);
  auVar79._6_2_ = -(ushort)(uStack_302 == 0);
  auVar79._8_2_ = -(ushort)(local_308 == 0);
  auVar79._10_2_ = -(ushort)(uStack_306 == 0);
  auVar79._12_2_ = -(ushort)(uStack_304 == 0);
  auVar79._14_2_ = -(ushort)(uStack_302 == 0);
  local_318._0_8_ = auVar38._0_8_;
  local_318._8_8_ = auVar38._8_8_;
  local_2f8 = auVar39._0_8_;
  lStack_2f0 = auVar39._8_8_;
  if ((ushort)((ushort)(SUB161(auVar79 >> 7,0) & 1) | (ushort)(SUB161(auVar79 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar79 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar79 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar79 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar79 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar79 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar79 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar79 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar79 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar79 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar79 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar79 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar79 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(auVar79._14_2_ >> 7) & 1) << 0xe | auVar79._14_2_ & 0x8000) == 0xffff
     ) {
    pq[0][0] = local_318._0_8_;
    pq[0][1] = local_2f8;
    pq[1][0] = local_318._8_8_;
    pq[1][1] = lStack_2f0;
  }
  else {
    local_248 = local_248 & local_308;
    uStack_246 = uStack_246 & uStack_306;
    uStack_244 = uStack_244 & uStack_304;
    uStack_242 = uStack_242 & uStack_302;
    uStack_240 = uStack_240 & local_308;
    uStack_23e = uStack_23e & uStack_306;
    uVar60 = (ushort)q1q0[0] & uStack_304;
    uVar61 = q1q0[0]._2_2_ & uStack_302;
    sVar83 = (short)pq[1][0] + (short)pq[0][0] + (short)pq[2][0];
    sVar84 = pq[1][0]._2_2_ + pq[0][0]._2_2_ + pq[2][0]._2_2_;
    sVar85 = pq[1][0]._4_2_ + pq[0][0]._4_2_ + pq[2][0]._4_2_;
    sVar86 = pq[1][0]._6_2_ + pq[0][0]._6_2_ + pq[2][0]._6_2_;
    sVar87 = (short)pq[1][1] + (short)pq[0][1] + (short)pq[2][1];
    sVar88 = pq[1][1]._2_2_ + pq[0][1]._2_2_ + pq[2][1]._2_2_;
    sVar89 = pq[1][1]._4_2_ + pq[0][1]._4_2_ + pq[2][1]._4_2_;
    sVar90 = pq[1][1]._6_2_ + pq[0][1]._6_2_ + pq[2][1]._6_2_;
    sVar68 = sVar87 + sVar83 + 4;
    sVar72 = sVar88 + sVar84 + 4;
    sVar74 = sVar89 + sVar85 + 4;
    sVar76 = sVar90 + sVar86 + 4;
    flat_pq[0][0]._0_2_ = (ushort)((short)pq[0][0] + (short)pq[3][0] + sVar68) >> 3;
    flat_pq[0][0]._2_2_ = (ushort)(pq[0][0]._2_2_ + pq[3][0]._2_2_ + sVar72) >> 3;
    flat_pq[0][0]._4_2_ = (ushort)(pq[0][0]._4_2_ + pq[3][0]._4_2_ + sVar74) >> 3;
    flat_pq[0][0]._6_2_ = (ushort)(pq[0][0]._6_2_ + pq[3][0]._6_2_ + sVar76) >> 3;
    flat_pq[0][1]._0_2_ = (ushort)((short)q[0][0] + (short)q[3][0] + sVar68) >> 3;
    flat_pq[0][1]._2_2_ = (ushort)(q[0][0]._2_2_ + q[3][0]._2_2_ + sVar72) >> 3;
    flat_pq[0][1]._4_2_ = (ushort)(q[0][0]._4_2_ + q[3][0]._4_2_ + sVar74) >> 3;
    flat_pq[0][1]._6_2_ = (ushort)(q[0][0]._6_2_ + q[3][0]._6_2_ + sVar76) >> 3;
    flat_pq[1][0]._0_2_ =
         (ushort)((sVar68 - (short)q[2][0]) + (short)pq[3][0] * 2 + (short)pq[1][0]) >> 3;
    flat_pq[1][0]._2_2_ =
         (ushort)((sVar72 - q[2][0]._2_2_) + pq[3][0]._2_2_ * 2 + pq[1][0]._2_2_) >> 3;
    flat_pq[1][0]._4_2_ =
         (ushort)((sVar74 - q[2][0]._4_2_) + pq[3][0]._4_2_ * 2 + pq[1][0]._4_2_) >> 3;
    flat_pq[1][0]._6_2_ =
         (ushort)((sVar76 - q[2][0]._6_2_) + pq[3][0]._6_2_ * 2 + pq[1][0]._6_2_) >> 3;
    flat_pq[1][1]._0_2_ =
         (ushort)((sVar68 - (short)pq[2][0]) + (short)pq[3][1] * 2 + (short)pq[1][1]) >> 3;
    flat_pq[1][1]._2_2_ =
         (ushort)((sVar72 - pq[2][0]._2_2_) + pq[3][1]._2_2_ * 2 + pq[1][1]._2_2_) >> 3;
    flat_pq[1][1]._4_2_ =
         (ushort)((sVar74 - pq[2][0]._4_2_) + pq[3][1]._4_2_ * 2 + pq[1][1]._4_2_) >> 3;
    flat_pq[1][1]._6_2_ =
         (ushort)((sVar76 - pq[2][0]._6_2_) + pq[3][1]._6_2_ * 2 + pq[1][1]._6_2_) >> 3;
    flat_pq[2][0]._0_2_ =
         (ushort)(((sVar68 - (short)q[2][0]) + (short)pq[3][0] * 3 + (short)pq[2][0]) -
                 (short)q[1][0]) >> 3;
    flat_pq[2][0]._2_2_ =
         (ushort)(((sVar72 - q[2][0]._2_2_) + pq[3][0]._2_2_ * 3 + pq[2][0]._2_2_) - q[1][0]._2_2_)
         >> 3;
    flat_pq[2][0]._4_2_ =
         (ushort)(((sVar74 - q[2][0]._4_2_) + pq[3][0]._4_2_ * 3 + pq[2][0]._4_2_) - q[1][0]._4_2_)
         >> 3;
    flat_pq[2][0]._6_2_ =
         (ushort)(((sVar76 - q[2][0]._6_2_) + pq[3][0]._6_2_ * 3 + pq[2][0]._6_2_) - q[1][0]._6_2_)
         >> 3;
    flat_pq[2][1]._0_2_ =
         (ushort)((((short)pq[3][1] * 3 + (short)pq[2][1]) - (short)pq[1][0]) +
                 (sVar68 - (short)pq[2][0])) >> 3;
    flat_pq[2][1]._2_2_ =
         (ushort)(((pq[3][1]._2_2_ * 3 + pq[2][1]._2_2_) - pq[1][0]._2_2_) +
                 (sVar72 - pq[2][0]._2_2_)) >> 3;
    flat_pq[2][1]._4_2_ =
         (ushort)(((pq[3][1]._4_2_ * 3 + pq[2][1]._4_2_) - pq[1][0]._4_2_) +
                 (sVar74 - pq[2][0]._4_2_)) >> 3;
    flat_pq[2][1]._6_2_ =
         (ushort)(((pq[3][1]._6_2_ * 3 + pq[2][1]._6_2_) - pq[1][0]._6_2_) +
                 (sVar76 - pq[2][0]._6_2_)) >> 3;
    auVar82._0_2_ = -(ushort)(local_248 == 0);
    auVar82._2_2_ = -(ushort)(uStack_246 == 0);
    auVar82._4_2_ = -(ushort)(uStack_244 == 0);
    auVar82._6_2_ = -(ushort)(uStack_242 == 0);
    auVar82._8_2_ = -(ushort)(uStack_240 == 0);
    auVar82._10_2_ = -(ushort)(uStack_23e == 0);
    auVar82._12_2_ = -(ushort)(uVar60 == 0);
    auVar82._14_2_ = -(ushort)(uVar61 == 0);
    uVar55 = ((ushort)(SUB161(auVar82 >> 7,0) & 1) | (ushort)(SUB161(auVar82 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar82 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar82 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar82 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar82 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar82 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar82 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar82 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar82 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar82 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar82 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar82 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar82 >> 0x6f,0) & 1) << 0xd |
              (ushort)((byte)(auVar82._14_2_ >> 7) & 1) << 0xe | auVar82._14_2_ & 0x8000) ^ 0xffff;
    if (uVar55 != 0) {
      sVar69 = (short)pq[6][0];
      sVar73 = pq[6][0]._2_2_;
      sVar75 = pq[6][0]._4_2_;
      sVar77 = pq[6][0]._6_2_;
      sVar42 = (short)pq[6][1];
      sVar67 = pq[6][1]._2_2_;
      sVar78 = pq[6][1]._4_2_;
      sVar81 = pq[6][1]._6_2_;
      sVar91 = (short)pq[4][0] + (short)pq[5][0] + (short)pq[3][0];
      sVar92 = pq[4][0]._2_2_ + pq[5][0]._2_2_ + pq[3][0]._2_2_;
      sVar93 = pq[4][0]._4_2_ + pq[5][0]._4_2_ + pq[3][0]._4_2_;
      sVar94 = pq[4][0]._6_2_ + pq[5][0]._6_2_ + pq[3][0]._6_2_;
      sVar95 = (short)pq[4][1] + (short)pq[5][1] + (short)pq[3][1];
      sVar96 = pq[4][1]._2_2_ + pq[5][1]._2_2_ + pq[3][1]._2_2_;
      sVar97 = pq[4][1]._4_2_ + pq[5][1]._4_2_ + pq[3][1]._4_2_;
      sVar98 = pq[4][1]._6_2_ + pq[5][1]._6_2_ + pq[3][1]._6_2_;
      sVar68 = sVar87 + sVar95 + sVar83 + sVar91 + 8;
      sVar72 = sVar88 + sVar96 + sVar84 + sVar92 + 8;
      sVar74 = sVar89 + sVar97 + sVar85 + sVar93 + 8;
      sVar76 = sVar90 + sVar98 + sVar86 + sVar94 + 8;
      local_1b8[0] = (ushort)(sVar68 + (short)q[0][0] + (short)pq[1][0] + (short)pq[0][0] + sVar69)
                     >> 4;
      local_1b8[1] = (ushort)(sVar72 + q[0][0]._2_2_ + pq[1][0]._2_2_ + pq[0][0]._2_2_ + sVar73) >>
                     4;
      local_1b8[2] = (ushort)(sVar74 + q[0][0]._4_2_ + pq[1][0]._4_2_ + pq[0][0]._4_2_ + sVar75) >>
                     4;
      local_1b8[3] = (ushort)(sVar76 + q[0][0]._6_2_ + pq[1][0]._6_2_ + pq[0][0]._6_2_ + sVar77) >>
                     4;
      local_1b8[4] = (ushort)((short)pq[1][1] + (short)pq[0][1] + sVar42 + (short)pq[0][0] + sVar68)
                     >> 4;
      local_1b8[5] = (ushort)(pq[1][1]._2_2_ + pq[0][1]._2_2_ + sVar67 + pq[0][0]._2_2_ + sVar72) >>
                     4;
      local_1b8[6] = (ushort)(pq[1][1]._4_2_ + pq[0][1]._4_2_ + sVar78 + pq[0][0]._4_2_ + sVar74) >>
                     4;
      local_1b8[7] = (ushort)(pq[1][1]._6_2_ + pq[0][1]._6_2_ + sVar81 + pq[0][0]._6_2_ + sVar76) >>
                     4;
      local_1b8[8] = (ushort)((sVar68 - (short)q[5][0]) + sVar69 * 2 + sVar83) >> 4;
      local_1b8[9] = (ushort)((sVar72 - q[5][0]._2_2_) + sVar73 * 2 + sVar84) >> 4;
      local_1b8[10] = (ushort)((sVar74 - q[5][0]._4_2_) + sVar75 * 2 + sVar85) >> 4;
      local_1b8[0xb] = (ushort)((sVar76 - q[5][0]._6_2_) + sVar77 * 2 + sVar86) >> 4;
      local_1b8[0xc] = (ushort)((sVar68 - (short)pq[5][0]) + sVar42 * 2 + sVar87) >> 4;
      local_1b8[0xd] = (ushort)((sVar72 - pq[5][0]._2_2_) + sVar67 * 2 + sVar88) >> 4;
      local_1b8[0xe] = (ushort)((sVar74 - pq[5][0]._4_2_) + sVar78 * 2 + sVar89) >> 4;
      local_1b8[0xf] = (ushort)((sVar76 - pq[5][0]._6_2_) + sVar81 * 2 + sVar90) >> 4;
      sVar83 = (sVar68 - (short)q[5][0]) - (short)q[4][0];
      sVar84 = (sVar72 - q[5][0]._2_2_) - q[4][0]._2_2_;
      sVar85 = (sVar74 - q[5][0]._4_2_) - q[4][0]._4_2_;
      sVar86 = (sVar76 - q[5][0]._6_2_) - q[4][0]._6_2_;
      sVar68 = (sVar68 - (short)pq[5][0]) - (short)pq[4][0];
      sVar72 = (sVar72 - pq[5][0]._2_2_) - pq[4][0]._2_2_;
      sVar74 = (sVar74 - pq[5][0]._4_2_) - pq[4][0]._4_2_;
      sVar76 = (sVar76 - pq[5][0]._6_2_) - pq[4][0]._6_2_;
      local_1b8[0x10] =
           (ushort)(sVar83 + (short)pq[1][0] + (short)pq[2][0] + (short)pq[3][0] + sVar69 * 3) >> 4;
      local_1b8[0x11] =
           (ushort)(sVar84 + pq[1][0]._2_2_ + pq[2][0]._2_2_ + pq[3][0]._2_2_ + sVar73 * 3) >> 4;
      local_1b8[0x12] =
           (ushort)(sVar85 + pq[1][0]._4_2_ + pq[2][0]._4_2_ + pq[3][0]._4_2_ + sVar75 * 3) >> 4;
      local_1b8[0x13] =
           (ushort)(sVar86 + pq[1][0]._6_2_ + pq[2][0]._6_2_ + pq[3][0]._6_2_ + sVar77 * 3) >> 4;
      local_1b8[0x14] =
           (ushort)(sVar68 + (short)pq[1][1] + (short)pq[2][1] + (short)pq[3][1] + sVar42 * 3) >> 4;
      local_1b8[0x15] =
           (ushort)(sVar72 + pq[1][1]._2_2_ + pq[2][1]._2_2_ + pq[3][1]._2_2_ + sVar67 * 3) >> 4;
      local_1b8[0x16] =
           (ushort)(sVar74 + pq[1][1]._4_2_ + pq[2][1]._4_2_ + pq[3][1]._4_2_ + sVar78 * 3) >> 4;
      local_1b8[0x17] =
           (ushort)(sVar76 + pq[1][1]._6_2_ + pq[2][1]._6_2_ + pq[3][1]._6_2_ + sVar81 * 3) >> 4;
      sVar83 = sVar83 - (short)q[3][0];
      sVar84 = sVar84 - q[3][0]._2_2_;
      sVar85 = sVar85 - q[3][0]._4_2_;
      sVar86 = sVar86 - q[3][0]._6_2_;
      sVar68 = sVar68 - (short)pq[3][0];
      sVar72 = sVar72 - pq[3][0]._2_2_;
      sVar74 = sVar74 - pq[3][0]._4_2_;
      sVar76 = sVar76 - pq[3][0]._6_2_;
      auVar38 = psllw((undefined1  [16])pq[6],2);
      local_1b8[0x18] =
           (ushort)(sVar83 + (short)pq[3][0] + (short)pq[4][0] + (short)pq[2][0] + auVar38._0_2_) >>
           4;
      local_1b8[0x19] =
           (ushort)(sVar84 + pq[3][0]._2_2_ + pq[4][0]._2_2_ + pq[2][0]._2_2_ + auVar38._2_2_) >> 4;
      local_1b8[0x1a] =
           (ushort)(sVar85 + pq[3][0]._4_2_ + pq[4][0]._4_2_ + pq[2][0]._4_2_ + auVar38._4_2_) >> 4;
      local_1b8[0x1b] =
           (ushort)(sVar86 + pq[3][0]._6_2_ + pq[4][0]._6_2_ + pq[2][0]._6_2_ + auVar38._6_2_) >> 4;
      local_1b8[0x1c] =
           (ushort)(sVar68 + (short)pq[3][1] + (short)pq[4][1] + (short)pq[2][1] + auVar38._8_2_) >>
           4;
      local_1b8[0x1d] =
           (ushort)(sVar72 + pq[3][1]._2_2_ + pq[4][1]._2_2_ + pq[2][1]._2_2_ + auVar38._10_2_) >> 4
      ;
      local_1b8[0x1e] =
           (ushort)(sVar74 + pq[3][1]._4_2_ + pq[4][1]._4_2_ + pq[2][1]._4_2_ + auVar38._12_2_) >> 4
      ;
      local_1b8[0x1f] =
           (ushort)(sVar76 + pq[3][1]._6_2_ + pq[4][1]._6_2_ + pq[2][1]._6_2_ + auVar38._14_2_) >> 4
      ;
      sVar83 = sVar83 - (short)q[2][0];
      sVar84 = sVar84 - q[2][0]._2_2_;
      sVar85 = sVar85 - q[2][0]._4_2_;
      sVar86 = sVar86 - q[2][0]._6_2_;
      sVar68 = sVar68 - (short)pq[2][0];
      sVar72 = sVar72 - pq[2][0]._2_2_;
      sVar74 = sVar74 - pq[2][0]._4_2_;
      sVar76 = sVar76 - pq[2][0]._6_2_;
      local_1b8[0x20] = (ushort)(sVar83 + sVar69 * 5 + sVar91) >> 4;
      local_1b8[0x21] = (ushort)(sVar84 + sVar73 * 5 + sVar92) >> 4;
      local_1b8[0x22] = (ushort)(sVar85 + sVar75 * 5 + sVar93) >> 4;
      local_1b8[0x23] = (ushort)(sVar86 + sVar77 * 5 + sVar94) >> 4;
      local_1b8[0x24] = (ushort)(sVar68 + sVar42 * 5 + sVar95) >> 4;
      local_1b8[0x25] = (ushort)(sVar72 + sVar67 * 5 + sVar96) >> 4;
      local_1b8[0x26] = (ushort)(sVar74 + sVar78 * 5 + sVar97) >> 4;
      local_1b8[0x27] = (ushort)(sVar76 + sVar81 * 5 + sVar98) >> 4;
      local_1b8[0x28] =
           (ushort)((((short)pq[4][0] + (short)pq[5][0] + sVar69 * 7) - (short)q[1][0]) + sVar83) >>
           4;
      local_1b8[0x29] =
           (ushort)(((pq[4][0]._2_2_ + pq[5][0]._2_2_ + sVar73 * 7) - q[1][0]._2_2_) + sVar84) >> 4;
      local_1b8[0x2a] =
           (ushort)(((pq[4][0]._4_2_ + pq[5][0]._4_2_ + sVar75 * 7) - q[1][0]._4_2_) + sVar85) >> 4;
      local_1b8[0x2b] =
           (ushort)(((pq[4][0]._6_2_ + pq[5][0]._6_2_ + sVar77 * 7) - q[1][0]._6_2_) + sVar86) >> 4;
      local_1b8[0x2c] =
           (ushort)((((short)pq[4][1] + (short)pq[5][1] + sVar42 * 7) - (short)pq[1][0]) + sVar68)
           >> 4;
      local_1b8[0x2d] =
           (ushort)(((pq[4][1]._2_2_ + pq[5][1]._2_2_ + sVar67 * 7) - pq[1][0]._2_2_) + sVar72) >> 4
      ;
      local_1b8[0x2e] =
           (ushort)(((pq[4][1]._4_2_ + pq[5][1]._4_2_ + sVar78 * 7) - pq[1][0]._4_2_) + sVar74) >> 4
      ;
      local_1b8[0x2f] =
           (ushort)(((pq[4][1]._6_2_ + pq[5][1]._6_2_ + sVar81 * 7) - pq[1][0]._6_2_) + sVar76) >> 4
      ;
    }
    pq[0][0] = local_318._0_8_;
    pq[0][1] = local_2f8;
    pq[1][0] = local_318._8_8_;
    pq[1][1] = lStack_2f0;
    for (lVar37 = 0; lVar37 != 0x30; lVar37 = lVar37 + 0x10) {
      uVar62 = *(ushort *)((long)pq[0] + lVar37);
      uVar63 = *(ushort *)((long)pq[0] + lVar37 + 2);
      uVar64 = *(ushort *)((long)pq[0] + lVar37 + 4);
      uVar65 = *(ushort *)((long)pq[0] + lVar37 + 6);
      uVar66 = *(ushort *)((long)pq[0] + lVar37 + 8);
      uVar22 = *(ushort *)((long)pq[0] + lVar37 + 10);
      uVar23 = *(ushort *)((long)pq[0] + lVar37 + 0xc);
      uVar43 = *(ushort *)((long)pq[0] + lVar37 + 0xe);
      uVar47 = *(ushort *)((long)flat_pq[0] + lVar37) & local_308;
      uVar48 = *(ushort *)((long)flat_pq[0] + lVar37 + 2) & uStack_306;
      uVar49 = *(ushort *)((long)flat_pq[0] + lVar37 + 4) & uStack_304;
      uVar50 = *(ushort *)((long)flat_pq[0] + lVar37 + 6) & uStack_302;
      uVar51 = *(ushort *)((long)flat_pq[0] + lVar37 + 8) & local_308;
      uVar52 = *(ushort *)((long)flat_pq[0] + lVar37 + 10) & uStack_306;
      uVar53 = *(ushort *)((long)flat_pq[0] + lVar37 + 0xc) & uStack_304;
      uVar54 = *(ushort *)((long)flat_pq[0] + lVar37 + 0xe) & uStack_302;
      *(ushort *)((long)flat_pq[0] + lVar37) = uVar47;
      *(ushort *)((long)flat_pq[0] + lVar37 + 2) = uVar48;
      *(ushort *)((long)flat_pq[0] + lVar37 + 4) = uVar49;
      *(ushort *)((long)flat_pq[0] + lVar37 + 6) = uVar50;
      *(ushort *)((long)flat_pq[0] + lVar37 + 8) = uVar51;
      *(ushort *)((long)flat_pq[0] + lVar37 + 10) = uVar52;
      *(ushort *)((long)flat_pq[0] + lVar37 + 0xc) = uVar53;
      *(ushort *)((long)flat_pq[0] + lVar37 + 0xe) = uVar54;
      *(ushort *)((long)pq[0] + lVar37) = uVar47 | uVar62 & (local_308 ^ 0xffff);
      *(ushort *)((long)pq[0] + lVar37 + 2) = uVar48 | uVar63 & (uStack_306 ^ 0xffff);
      *(ushort *)((long)pq[0] + lVar37 + 4) = uVar49 | uVar64 & (uStack_304 ^ 0xffff);
      *(ushort *)((long)pq[0] + lVar37 + 6) = uVar50 | uVar65 & (uStack_302 ^ 0xffff);
      *(ushort *)((long)pq[0] + lVar37 + 8) = uVar51 | uVar66 & (local_308 ^ 0xffff);
      *(ushort *)((long)pq[0] + lVar37 + 10) = uVar52 | uVar22 & (uStack_306 ^ 0xffff);
      *(ushort *)((long)pq[0] + lVar37 + 0xc) = uVar53 | uVar23 & (uStack_304 ^ 0xffff);
      *(ushort *)((long)pq[0] + lVar37 + 0xe) = uVar54 | uVar43 & (uStack_302 ^ 0xffff);
    }
    if (uVar55 != 0) {
      for (lVar37 = 0; lVar37 != 0x60; lVar37 = lVar37 + 0x10) {
        uVar55 = *(ushort *)((long)pq[0] + lVar37);
        uVar62 = *(ushort *)((long)pq[0] + lVar37 + 2);
        uVar63 = *(ushort *)((long)pq[0] + lVar37 + 4);
        uVar64 = *(ushort *)((long)pq[0] + lVar37 + 6);
        uVar65 = *(ushort *)((long)pq[0] + lVar37 + 8);
        uVar66 = *(ushort *)((long)pq[0] + lVar37 + 10);
        uVar22 = *(ushort *)((long)pq[0] + lVar37 + 0xc);
        uVar23 = *(ushort *)((long)pq[0] + lVar37 + 0xe);
        uVar43 = *(ushort *)((long)local_1b8 + lVar37) & local_248;
        uVar47 = *(ushort *)((long)local_1b8 + lVar37 + 2) & uStack_246;
        uVar48 = *(ushort *)((long)local_1b8 + lVar37 + 4) & uStack_244;
        uVar49 = *(ushort *)((long)local_1b8 + lVar37 + 6) & uStack_242;
        uVar50 = *(ushort *)((long)local_1b8 + lVar37 + 8) & uStack_240;
        uVar51 = *(ushort *)((long)local_1b8 + lVar37 + 10) & uStack_23e;
        uVar52 = *(ushort *)((long)local_1b8 + lVar37 + 0xc) & uVar60;
        uVar53 = *(ushort *)((long)local_1b8 + lVar37 + 0xe) & uVar61;
        *(ushort *)((long)local_1b8 + lVar37) = uVar43;
        *(ushort *)((long)local_1b8 + lVar37 + 2) = uVar47;
        *(ushort *)((long)local_1b8 + lVar37 + 4) = uVar48;
        *(ushort *)((long)local_1b8 + lVar37 + 6) = uVar49;
        *(ushort *)((long)local_1b8 + lVar37 + 8) = uVar50;
        *(ushort *)((long)local_1b8 + lVar37 + 10) = uVar51;
        *(ushort *)((long)local_1b8 + lVar37 + 0xc) = uVar52;
        *(ushort *)((long)local_1b8 + lVar37 + 0xe) = uVar53;
        *(ushort *)((long)pq[0] + lVar37) = uVar43 | uVar55 & (local_248 ^ 0xffff);
        *(ushort *)((long)pq[0] + lVar37 + 2) = uVar47 | uVar62 & (uStack_246 ^ 0xffff);
        *(ushort *)((long)pq[0] + lVar37 + 4) = uVar48 | uVar63 & (uStack_244 ^ 0xffff);
        *(ushort *)((long)pq[0] + lVar37 + 6) = uVar49 | uVar64 & (uStack_242 ^ 0xffff);
        *(ushort *)((long)pq[0] + lVar37 + 8) = uVar50 | uVar65 & (uStack_240 ^ 0xffff);
        *(ushort *)((long)pq[0] + lVar37 + 10) = uVar51 | uVar66 & (uStack_23e ^ 0xffff);
        *(ushort *)((long)pq[0] + lVar37 + 0xc) = uVar52 | uVar22 & (uVar60 ^ 0xffff);
        *(ushort *)((long)pq[0] + lVar37 + 0xe) = uVar53 | uVar23 & (uVar61 ^ 0xffff);
      }
    }
  }
  puVar35 = s + -lVar36;
  for (lVar37 = 0; lVar37 != 0x60; lVar37 = lVar37 + 0x10) {
    uVar1 = *(undefined8 *)((long)pq[0] + lVar37 + 8);
    *(undefined8 *)puVar35 = *(undefined8 *)((long)pq[0] + lVar37);
    *(undefined8 *)s = uVar1;
    puVar35 = puVar35 + -lVar36;
    s = s + lVar36;
  }
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_14_sse2(uint16_t *s, int pitch,
                                       const uint8_t *blimit,
                                       const uint8_t *limit,
                                       const uint8_t *thresh, int bd) {
  __m128i p[7], q[7], pq[7];
  int i;

  for (i = 0; i < 7; i++) {
    p[i] = _mm_loadl_epi64((__m128i *)(s - (i + 1) * pitch));
    q[i] = _mm_loadl_epi64((__m128i *)(s + i * pitch));
  }

  highbd_lpf_internal_14_sse2(p, q, pq, blimit, limit, thresh, bd);

  for (i = 0; i < 6; i++) {
    _mm_storel_epi64((__m128i *)(s - (i + 1) * pitch), pq[i]);
    _mm_storel_epi64((__m128i *)(s + i * pitch), _mm_srli_si128(pq[i], 8));
  }
}